

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_entry_from_file.c
# Opt level: O1

int archive_read_disk_entry_from_file(archive *_a,archive_entry *entry,int fd,stat *st)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  mode_t mVar5;
  char *pcVar6;
  int64_t iVar7;
  char *pcVar8;
  int *piVar10;
  long lVar11;
  char *__path;
  void *__value;
  size_t size;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  byte *pbVar15;
  size_t sVar16;
  stat s;
  int local_10ec;
  int local_10e4;
  stat local_10c8;
  long local_1038 [2];
  undefined4 local_1028;
  uint local_1024;
  undefined4 local_1020;
  byte local_ff0 [4032];
  ssize_t sVar9;
  
  archive_clear_error(_a);
  pcVar6 = archive_entry_sourcepath(entry);
  if (pcVar6 == (char *)0x0) {
    pcVar6 = archive_entry_pathname(entry);
  }
  if (_a[1].vtable == (archive_vtable_conflict *)0x0) {
    if (st == (stat *)0x0) {
      if (fd < 0) {
        if (*(char *)((long)&_a[1].magic + 1) == '\0') {
          st = &local_10c8;
          iVar3 = lstat(pcVar6,(stat *)st);
          if (iVar3 != 0) {
            piVar10 = __errno_location();
            iVar3 = *piVar10;
            pcVar8 = "Can\'t lstat %s";
            goto LAB_00160589;
          }
        }
        else {
          st = &local_10c8;
          iVar3 = stat(pcVar6,(stat *)st);
          if (iVar3 != 0) {
            piVar10 = __errno_location();
            iVar3 = *piVar10;
            pcVar8 = "Can\'t stat %s";
LAB_00160589:
            archive_set_error(_a,iVar3,pcVar8,pcVar6);
            return -0x19;
          }
        }
      }
      else {
        st = &local_10c8;
        iVar3 = fstat(fd,(stat *)st);
        if (iVar3 != 0) {
          piVar10 = __errno_location();
          iVar3 = *piVar10;
          pcVar6 = "Can\'t fstat";
          goto LAB_00160345;
        }
      }
    }
    archive_entry_copy_stat(entry,st);
  }
  iVar7 = archive_entry_uid(entry);
  pcVar8 = archive_read_disk_uname(_a,iVar7);
  if (pcVar8 != (char *)0x0) {
    archive_entry_copy_uname(entry,pcVar8);
  }
  iVar7 = archive_entry_gid(entry);
  pcVar8 = archive_read_disk_gname(_a,iVar7);
  if (pcVar8 != (char *)0x0) {
    archive_entry_copy_gname(entry,pcVar8);
  }
  if ((st->st_mode & 0xf000) == 0xa000) {
    sVar16 = st->st_size + 1;
    pcVar8 = (char *)malloc(sVar16);
    if (pcVar8 == (char *)0x0) {
      pcVar6 = "Couldn\'t read link data";
      iVar3 = 0xc;
LAB_00160345:
      archive_set_error(_a,iVar3,pcVar6);
      return -0x19;
    }
    if (_a[1].vtable == (archive_vtable_conflict *)0x0) {
      sVar9 = readlink(pcVar6,pcVar8,sVar16);
      uVar4 = (uint)sVar9;
    }
    else {
      iVar3 = (*(code *)_a[1].archive_format_name)();
      sVar9 = readlinkat(iVar3,pcVar6,pcVar8,sVar16);
      uVar4 = (uint)sVar9;
    }
    if ((int)uVar4 < 0) {
      piVar10 = __errno_location();
      archive_set_error(_a,*piVar10,"Couldn\'t read link data");
      free(pcVar8);
      return -0x19;
    }
    pcVar8[uVar4 & 0x7fffffff] = '\0';
    archive_entry_set_symlink(entry,pcVar8);
    free(pcVar8);
  }
  pcVar6 = archive_entry_sourcepath(entry);
  if (pcVar6 == (char *)0x0) {
    pcVar6 = archive_entry_pathname(entry);
  }
  local_10ec = fd;
  if ((fd < 0) && (_a[1].vtable != (archive_vtable_conflict *)0x0)) {
    if ((*(char *)((long)&_a[1].magic + 1) != '\0') ||
       (mVar5 = archive_entry_filetype(entry), mVar5 != 0xa000)) {
      local_10ec = (**(code **)&_a[1].archive_format)(_a[1].vtable,pcVar6,0x800);
    }
    if ((-1 < local_10ec) ||
       (iVar3 = (**(code **)&_a[1].compression_code)(_a[1].vtable), iVar3 == 0)) goto LAB_001603a9;
    piVar10 = __errno_location();
    archive_set_error(_a,*piVar10,"Couldn\'t access %s",pcVar6);
    local_10e4 = -0x19;
  }
  else {
LAB_001603a9:
    if (local_10ec < 0) {
      if (*(char *)((long)&_a[1].magic + 1) == '\0') {
        sVar16 = llistxattr(pcVar6,(char *)0x0,0);
      }
      else {
        sVar16 = listxattr(pcVar6,(char *)0x0,0);
      }
    }
    else {
      sVar16 = flistxattr(local_10ec,(char *)0x0,0);
    }
    local_10e4 = 0;
    if (sVar16 != 0) {
      if (sVar16 == 0xffffffffffffffff) {
        piVar10 = __errno_location();
        iVar3 = *piVar10;
        if ((iVar3 != 0x26) && (iVar3 != 0x5f)) {
          archive_set_error(_a,iVar3,"Couldn\'t list extended attributes");
LAB_001607b7:
          local_10e4 = -0x14;
        }
      }
      else {
        pcVar8 = (char *)malloc(sVar16);
        if (pcVar8 == (char *)0x0) {
          piVar10 = __errno_location();
          archive_set_error(_a,*piVar10,"Out of memory");
          local_10e4 = -0x1e;
        }
        else {
          if (local_10ec < 0) {
            if (*(char *)((long)&_a[1].magic + 1) == '\0') {
              lVar11 = llistxattr(pcVar6,pcVar8,sVar16);
            }
            else {
              lVar11 = listxattr(pcVar6,pcVar8,sVar16);
            }
          }
          else {
            lVar11 = flistxattr(local_10ec,pcVar8,sVar16);
          }
          if (lVar11 == -1) {
            piVar10 = __errno_location();
            archive_set_error(_a,*piVar10,"Couldn\'t retrieve extended attributes");
            free(pcVar8);
            goto LAB_001607b7;
          }
          pcVar6 = pcVar8;
          if (0 < lVar11) {
            do {
              iVar3 = strncmp(pcVar6,"system.",7);
              if ((iVar3 != 0) && (iVar3 = strncmp(pcVar6,"xfsroot.",8), iVar3 != 0)) {
                __path = archive_entry_sourcepath(entry);
                if (__path == (char *)0x0) {
                  __path = archive_entry_pathname(entry);
                }
                if (local_10ec < 0) {
                  if (*(char *)((long)&_a[1].magic + 1) == '\0') {
                    sVar16 = lgetxattr(__path,pcVar6,(void *)0x0,0);
                  }
                  else {
                    sVar16 = getxattr(__path,pcVar6,(void *)0x0,0);
                  }
                }
                else {
                  sVar16 = fgetxattr(local_10ec,pcVar6,(void *)0x0,0);
                }
                if (sVar16 == 0xffffffffffffffff) {
                  piVar10 = __errno_location();
                  archive_set_error(_a,*piVar10,"Couldn\'t query extended attribute");
                }
                else {
                  if ((long)sVar16 < 1) {
                    __value = (void *)0x0;
                  }
                  else {
                    __value = malloc(sVar16);
                    if (__value == (void *)0x0) {
                      piVar10 = __errno_location();
                      archive_set_error(_a,*piVar10,"Out of memory");
                      goto LAB_0016076b;
                    }
                  }
                  if (local_10ec < 0) {
                    if (*(char *)((long)&_a[1].magic + 1) == '\0') {
                      size = lgetxattr(__path,pcVar6,__value,sVar16);
                    }
                    else {
                      size = getxattr(__path,pcVar6,__value,sVar16);
                    }
                  }
                  else {
                    size = fgetxattr(local_10ec,pcVar6,__value,sVar16);
                  }
                  if (size == 0xffffffffffffffff) {
                    piVar10 = __errno_location();
                    archive_set_error(_a,*piVar10,"Couldn\'t read extended attribute");
                  }
                  else {
                    archive_entry_xattr_add_entry(entry,pcVar6,__value,size);
                    free(__value);
                  }
                }
              }
LAB_0016076b:
              sVar16 = strlen(pcVar6);
              pcVar6 = pcVar6 + sVar16 + 1;
            } while ((long)pcVar6 - (long)pcVar8 < lVar11);
          }
          free(pcVar8);
        }
      }
    }
  }
  mVar5 = archive_entry_filetype(entry);
  iVar3 = 0;
  if (((mVar5 == 0x8000) && (iVar7 = archive_entry_size(entry), 0 < iVar7)) &&
     (pcVar6 = archive_entry_hardlink(entry), pcVar6 == (char *)0x0)) {
    if (local_10ec < 0) {
      pcVar6 = archive_entry_sourcepath(entry);
      if (pcVar6 == (char *)0x0) {
        pcVar6 = archive_entry_pathname(entry);
      }
      if (_a[1].vtable == (archive_vtable_conflict *)0x0) {
        local_10ec = open(pcVar6,0x80800);
      }
      else {
        local_10ec = (**(code **)&_a[1].archive_format)(_a[1].vtable,pcVar6,0x80800);
      }
      if (local_10ec < 0) {
        piVar10 = __errno_location();
        archive_set_error(_a,*piVar10,"Can\'t open `%s\'",pcVar6);
        iVar3 = -0x19;
        goto LAB_001607f3;
      }
      __archive_ensure_cloexec_flag(local_10ec);
    }
    memset(local_1038,0,0x1000);
    local_1038[1] = 0xffffffffffffffff;
    local_1028 = 1;
    local_1020 = 0x48;
    uVar12 = archive_entry_size(entry);
    bVar1 = true;
    do {
      iVar3 = ioctl(local_10ec,0xc020660b,local_1038);
      if ((iVar3 < 0) || (local_1024 == 0)) {
        bVar2 = false;
      }
      else {
        if (0 < (int)local_1024) {
          iVar3 = 0;
          pbVar15 = local_ff0;
          do {
            if ((pbVar15[1] & 8) == 0) {
              lVar11 = *(long *)(pbVar15 + -0x28);
              uVar13 = lVar11 + *(long *)(pbVar15 + -0x18);
              lVar14 = 0;
              if (uVar12 <= uVar13) {
                lVar14 = uVar13 - uVar12;
              }
              uVar13 = *(long *)(pbVar15 + -0x18) - lVar14;
              bVar2 = false;
              if ((uVar13 != uVar12 || lVar11 != 0) && (bVar2 = bVar1, 0 < (long)uVar13)) {
                archive_entry_sparse_add_entry(entry,lVar11,uVar13);
              }
              bVar1 = bVar2;
              if (uVar13 == uVar12 && lVar11 == 0) break;
            }
            if ((*pbVar15 & 1) != 0) {
              bVar1 = false;
            }
            iVar3 = iVar3 + 1;
            pbVar15 = pbVar15 + 0x38;
          } while (iVar3 < (int)local_1024);
        }
        if (bVar1) {
          local_1038[0] =
               local_1038[(ulong)local_1024 * 7 + -1] +
               local_10c8.__glibc_reserved[(ulong)local_1024 * 7];
          bVar2 = true;
          bVar1 = true;
        }
        else {
          bVar1 = false;
          bVar2 = false;
        }
      }
    } while (bVar2);
    iVar3 = 0;
  }
LAB_001607f3:
  if (iVar3 < local_10e4) {
    local_10e4 = iVar3;
  }
  if (local_10ec != fd) {
    close(local_10ec);
  }
  return local_10e4;
}

Assistant:

int
archive_read_disk_entry_from_file(struct archive *_a,
    struct archive_entry *entry,
    int fd,
    const struct stat *st)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	const char *path, *name;
	struct stat s;
	int initial_fd = fd;
	int r, r1;

	archive_clear_error(_a);
	path = archive_entry_sourcepath(entry);
	if (path == NULL)
		path = archive_entry_pathname(entry);

	if (a->tree == NULL) {
		if (st == NULL) {
#if HAVE_FSTAT
			if (fd >= 0) {
				if (fstat(fd, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't fstat");
					return (ARCHIVE_FAILED);
				}
			} else
#endif
#if HAVE_LSTAT
			if (!a->follow_symlinks) {
				if (lstat(path, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't lstat %s", path);
					return (ARCHIVE_FAILED);
				}
			} else
#endif
			if (stat(path, &s) != 0) {
				archive_set_error(&a->archive, errno,
				    "Can't stat %s", path);
				return (ARCHIVE_FAILED);
			}
			st = &s;
		}
		archive_entry_copy_stat(entry, st);
	}

	/* Lookup uname/gname */
	name = archive_read_disk_uname(_a, archive_entry_uid(entry));
	if (name != NULL)
		archive_entry_copy_uname(entry, name);
	name = archive_read_disk_gname(_a, archive_entry_gid(entry));
	if (name != NULL)
		archive_entry_copy_gname(entry, name);

#ifdef HAVE_STRUCT_STAT_ST_FLAGS
	/* On FreeBSD, we get flags for free with the stat. */
	/* TODO: Does this belong in copy_stat()? */
	if (st->st_flags != 0)
		archive_entry_set_fflags(entry, st->st_flags, 0);
#endif

#if defined(EXT2_IOC_GETFLAGS) && defined(HAVE_WORKING_EXT2_IOC_GETFLAGS)
	/* Linux requires an extra ioctl to pull the flags.  Although
	 * this is an extra step, it has a nice side-effect: We get an
	 * open file descriptor which we can use in the subsequent lookups. */
	if ((S_ISREG(st->st_mode) || S_ISDIR(st->st_mode))) {
		if (fd < 0) {
			if (a->tree != NULL)
				fd = a->open_on_current_dir(a->tree, path,
					O_RDONLY | O_NONBLOCK | O_CLOEXEC);
			else
				fd = open(path, O_RDONLY | O_NONBLOCK |
						O_CLOEXEC);
			__archive_ensure_cloexec_flag(fd);
		}
		if (fd >= 0) {
			int stflags;
			r = ioctl(fd, EXT2_IOC_GETFLAGS, &stflags);
			if (r == 0 && stflags != 0)
				archive_entry_set_fflags(entry, stflags, 0);
		}
	}
#endif

#if defined(HAVE_READLINK) || defined(HAVE_READLINKAT)
	if (S_ISLNK(st->st_mode)) {
		size_t linkbuffer_len = st->st_size + 1;
		char *linkbuffer;
		int lnklen;

		linkbuffer = malloc(linkbuffer_len);
		if (linkbuffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Couldn't read link data");
			return (ARCHIVE_FAILED);
		}
		if (a->tree != NULL) {
#ifdef HAVE_READLINKAT
			lnklen = readlinkat(a->tree_current_dir_fd(a->tree),
			    path, linkbuffer, linkbuffer_len);
#else
			if (a->tree_enter_working_dir(a->tree) != 0) {
				archive_set_error(&a->archive, errno,
				    "Couldn't read link data");
				free(linkbuffer);
				return (ARCHIVE_FAILED);
			}
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
#endif /* HAVE_READLINKAT */
		} else
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
		if (lnklen < 0) {
			archive_set_error(&a->archive, errno,
			    "Couldn't read link data");
			free(linkbuffer);
			return (ARCHIVE_FAILED);
		}
		linkbuffer[lnklen] = 0;
		archive_entry_set_symlink(entry, linkbuffer);
		free(linkbuffer);
	}
#endif /* HAVE_READLINK || HAVE_READLINKAT */

	r = setup_acls(a, entry, &fd);
	r1 = setup_xattrs(a, entry, &fd);
	if (r1 < r)
		r = r1;
	if (a->enable_copyfile) {
		r1 = setup_mac_metadata(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}
	r1 = setup_sparse(a, entry, &fd);
	if (r1 < r)
		r = r1;

	/* If we opened the file earlier in this function, close it. */
	if (initial_fd != fd)
		close(fd);
	return (r);
}